

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AddVerify.cpp
# Opt level: O2

void AddVerifyBase<long,short>(char *types)

{
  int iVar1;
  bool bVar2;
  uint uVar3;
  SafeInt<short,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_> rhs;
  pointer t;
  bool bVar4;
  TestCase<long,_short,_3> TVar5;
  allocator local_c5;
  int local_c4;
  char *local_c0;
  string msg;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  TestVector<long,_short,_3> tests;
  long ret;
  
  tests.test_cases = (TestCase<long,_short,_3> *)0x0;
  tests.count = 0;
  tests.current = 0;
  local_c0 = types;
  TVar5 = TestVector<long,_short,_3>::GetNext(&tests);
  while( true ) {
    t = (pointer)TVar5.x;
    if (tests.count <= tests.current) break;
    rhs.m_int = TVar5.y;
    bVar2 = SafeAdd<long,short>((long)t,rhs.m_int,&ret);
    bVar4 = TVar5.fExpected;
    if (bVar4 != bVar2) {
      std::__cxx11::string::string((string *)&local_98,"Error in case ",&local_c5);
      std::operator+(&local_78,&local_98,local_c0);
      std::operator+(&msg,&local_78,": ");
      std::__cxx11::string::~string((string *)&local_78);
      std::__cxx11::string::~string((string *)&local_98);
      std::__cxx11::string::string((string *)&local_78,msg._M_dataplus._M_p,(allocator *)&local_98);
      err_msg<long,short>(&local_78,(long)t,rhs.m_int,(bool)(bVar4 & 1));
      std::__cxx11::string::~string((string *)&local_78);
      std::__cxx11::string::~string((string *)&msg);
    }
    local_c4 = (int)rhs.m_int;
    msg._M_dataplus._M_p = t;
    SafeInt<long,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>::operator+=
              ((SafeInt<long,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>
                *)&msg,rhs.m_int);
    uVar3 = TVar5._10_4_ & 0xff;
    if (uVar3 != 1) {
      std::__cxx11::string::string((string *)&local_98,"Error in case ",&local_c5);
      std::operator+(&local_78,&local_98,local_c0);
      std::operator+(&msg,&local_78," throw (1): ");
      std::__cxx11::string::~string((string *)&local_78);
      std::__cxx11::string::~string((string *)&local_98);
      std::__cxx11::string::string((string *)&local_78,msg._M_dataplus._M_p,(allocator *)&local_98);
      err_msg<long,short>(&local_78,(long)t,(short)local_c4,(bool)(bVar4 & 1));
      std::__cxx11::string::~string((string *)&local_78);
      std::__cxx11::string::~string((string *)&msg);
    }
    msg._M_dataplus._M_p = t;
    operator+=((long *)&msg,rhs);
    if (uVar3 != 1) {
      std::__cxx11::string::string((string *)&local_98,"Error in case ",&local_c5);
      std::operator+(&local_78,&local_98,local_c0);
      iVar1 = local_c4;
      std::operator+(&msg,&local_78," throw (2): ");
      std::__cxx11::string::~string((string *)&local_78);
      std::__cxx11::string::~string((string *)&local_98);
      std::__cxx11::string::string((string *)&local_78,msg._M_dataplus._M_p,(allocator *)&local_98);
      err_msg<long,short>(&local_78,(long)t,(short)iVar1,(bool)(bVar4 & 1));
      std::__cxx11::string::~string((string *)&local_78);
      std::__cxx11::string::~string((string *)&msg);
    }
    TVar5 = TestVector<long,_short,_3>::GetNext(&tests);
  }
  return;
}

Assistant:

void AddVerifyBase(const char* types)
{
	TestVector< T, U, OpType::Add > tests;
	TestCase< T, U, OpType::Add > test = tests.GetNext();

	while (!tests.Done())
	{
		T ret;
		if (SafeAdd(test.x, test.y, ret) != test.fExpected)
		{
			std::string msg = std::string("Error in case ") + types + ": ";
			err_msg(msg.c_str(), test.x, test.y, test.fExpected);
		}

		// Now test throwing version
		bool fSuccess = true;
		try
		{
			SafeInt<T> si(test.x);
			si += test.y;
		}
		catch (...)
		{
			fSuccess = false;
		}

		if (fSuccess != test.fExpected)
		{
			std::string msg = std::string("Error in case ") + types + " throw (1): ";
			err_msg(msg.c_str(), test.x, test.y, test.fExpected);
		}

		// Also need to test the version that assigns back out
		// to a plain int, as it has different logic
		fSuccess = true;
		try
		{
			T x(test.x);
			x += SafeInt<U>(test.y);
		}
		catch (...)
		{
			fSuccess = false;
		}

		if (fSuccess != test.fExpected)
		{
			std::string msg = std::string("Error in case ") + types + " throw (2): ";
			err_msg(msg.c_str(), test.x, test.y, test.fExpected);
		}

		test = tests.GetNext();
	}
}